

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O1

int GeneratedSaxParser::Utils::toInteger<int,true>
              (ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  
  pbVar3 = (byte *)*buffer;
  if (pbVar3 == (byte *)0x0) {
    *failed = true;
    return 0;
  }
  if (pbVar3 == (byte *)bufferEnd) {
    *failed = true;
    *buffer = bufferEnd;
    return 0;
  }
  while( true ) {
    uVar5 = (ulong)*pbVar3;
    if (0x2d < uVar5) goto LAB_0082f67f;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar3 = pbVar3 + 1;
    if (pbVar3 == (byte *)bufferEnd) {
      *failed = true;
      *buffer = bufferEnd;
      return 0;
    }
  }
  if (uVar5 == 0x2b) {
    pbVar3 = pbVar3 + 1;
  }
  else if (uVar5 == 0x2d) {
    pbVar3 = pbVar3 + 1;
    iVar4 = -1;
    goto LAB_0082f685;
  }
LAB_0082f67f:
  iVar4 = 1;
LAB_0082f685:
  if (pbVar3 == (byte *)bufferEnd) {
    iVar2 = 0;
    pbVar6 = pbVar3;
LAB_0082f6ea:
    if (pbVar3 == (byte *)bufferEnd) {
      *failed = true;
      *buffer = (ParserChar *)pbVar6;
      return 0;
    }
    *failed = false;
    *buffer = (ParserChar *)pbVar6;
  }
  else {
    bVar8 = *pbVar3;
    bVar1 = bVar8 - 0x30;
    iVar2 = 0;
    pbVar7 = pbVar3;
    if (bVar1 < 10) {
      iVar2 = 0;
      do {
        pbVar7 = pbVar7 + 1;
        iVar2 = (uint)bVar8 + iVar2 * 10 + -0x30;
        pbVar6 = (byte *)bufferEnd;
        if (pbVar7 == (byte *)bufferEnd) goto LAB_0082f6ea;
        bVar8 = *pbVar7;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    if (9 < bVar1) {
      *failed = true;
      *buffer = (ParserChar *)pbVar7;
      return 0;
    }
    *buffer = (ParserChar *)pbVar7;
    *failed = false;
  }
  return iVar2 * iVar4;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
	{
		const ParserChar* s = *buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( s == bufferEnd )
		{
			failed = true;
			*buffer = bufferEnd;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( s == bufferEnd )
			{
				failed = true;
				*buffer = bufferEnd;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( s == bufferEnd )
			{
				if (digitFound)
				{
					failed = false;
					*buffer = s;
					if ( signedInteger )
						return value * sign;
					else
						return value;
				}
				else
				{
					failed = true;
					*buffer = s;
					return 0;
				}
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
				break;
			++s;
		}
		if ( digitFound )
		{
			*buffer = s;
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			*buffer = s;
			return 0;
		}
	}